

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block-utils.h
# Opt level: O1

Expression * __thiscall
wasm::BlockUtils::simplifyToContents<wasm::Vacuum>
          (BlockUtils *this,Block *block,Vacuum *parent,bool allowTypeChange)

{
  bool bVar1;
  Expression *ast;
  undefined7 in_register_00000009;
  Nop *output;
  Name target;
  EffectAnalyzer local_198;
  undefined4 local_34;
  
  target.super_IString.str._M_str._1_7_ = in_register_00000009;
  target.super_IString.str._M_str._0_1_ = allowTypeChange;
  if ((*(long *)(this + 0x28) != 1) ||
     (target.super_IString.str._M_len = *(size_t *)(this + 0x18),
     bVar1 = BranchUtils::BranchSeeker::has
                       ((BranchSeeker *)**(undefined8 **)(this + 0x20),*(Expression **)(this + 0x10)
                        ,target), bVar1)) {
    if (*(long *)(this + 0x28) != 0) {
      return (Expression *)this;
    }
    *this = (BlockUtils)0x16;
    *(undefined8 *)(this + 8) = 0;
    return (Expression *)this;
  }
  local_34 = SUB84(parent,0);
  if (*(long *)(this + 0x28) == 0) {
    __assert_fail("index < usedElements",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/mixed_arena.h"
                  ,0xbc,
                  "T &ArenaVectorBase<ArenaVector<wasm::Expression *>, wasm::Expression *>::operator[](size_t) const [SubType = ArenaVector<wasm::Expression *>, T = wasm::Expression *]"
                 );
  }
  ast = (Expression *)**(undefined8 **)(this + 0x20);
  EffectAnalyzer::EffectAnalyzer
            (&local_198,
             (PassOptions *)
             ((block->super_SpecificExpression<(wasm::Expression::Id)1>).super_Expression.type.id +
             0x30),(Module *)
                   block[4].list.
                   super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
                   usedElements,ast);
  bVar1 = true;
  if (local_198.trap == false) {
    bVar1 = EffectAnalyzer::hasNonTrapSideEffects(&local_198);
  }
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_198.delegateTargets._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_198.breakTargets._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_198.globalsWritten._M_t);
  std::
  _Rb_tree<wasm::Name,_wasm::Name,_std::_Identity<wasm::Name>,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>
  ::~_Rb_tree(&local_198.mutableGlobalsRead._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_198.localsWritten._M_t);
  std::
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  ::~_Rb_tree(&local_198.localsRead._M_t);
  if ((bVar1 == false) && ((ast->type).id < 2)) {
    local_198._0_8_ =
         block[4].list.super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.
         usedElements;
    ast = Builder::replaceWithIdenticalType<wasm::Block>((Builder *)&local_198,(Block *)this);
  }
  else {
    bVar1 = wasm::Type::isSubType((Type)(ast->type).id,(Type)*(uintptr_t *)(this + 8));
    if (!bVar1 && (char)local_34 == '\0') {
      if ((*(ulong *)(this + 8) < 2) || ((ast->type).id != 1)) {
        __assert_fail("block->type.isConcrete() && singleton->type == Type::unreachable",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/ir/block-utils.h"
                      ,0x36,
                      "Expression *wasm::BlockUtils::simplifyToContents(Block *, T *, bool) [T = wasm::Vacuum]"
                     );
      }
      bVar1 = true;
      goto LAB_00b8a1c6;
    }
  }
  bVar1 = false;
LAB_00b8a1c6:
  if (bVar1) {
    return (Expression *)this;
  }
  return ast;
}

Assistant:

inline Expression*
simplifyToContents(Block* block, T* parent, bool allowTypeChange = false) {
  auto& list = block->list;
  if (list.size() == 1 &&
      !BranchUtils::BranchSeeker::has(list[0], block->name)) {
    // just one element. try to replace the block
    auto* singleton = list[0];
    auto sideEffects =
      EffectAnalyzer(parent->getPassOptions(), *parent->getModule(), singleton)
        .hasSideEffects();
    if (!sideEffects && !singleton->type.isConcrete()) {
      // no side effects, and singleton is not returning a value, so we can
      // throw away the block and its contents, basically
      return Builder(*parent->getModule()).replaceWithIdenticalType(block);
    } else if (Type::isSubType(singleton->type, block->type) ||
               allowTypeChange) {
      return singleton;
    } else {
      // (side effects +) type change, must be block with declared value but
      // inside is unreachable (if both concrete, must match, and since no name
      // on block, we can't be branched to, so if singleton is unreachable, so
      // is the block)
      assert(block->type.isConcrete() && singleton->type == Type::unreachable);
      // we could replace with unreachable, but would need to update all
      // the parent's types
    }
  } else if (list.size() == 0) {
    ExpressionManipulator::nop(block);
  }
  return block;
}